

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unifiedcache.cpp
# Opt level: O2

UBool __thiscall icu_63::UnifiedCache::_flush(UnifiedCache *this,UBool all)

{
  SharedObject *value;
  UBool UVar1;
  int32_t iVar2;
  UHashElement *element;
  int iVar3;
  bool bVar4;
  
  iVar2 = uhash_count_63(this->fHashtable);
  iVar3 = 0;
  if (iVar2 < 1) {
    iVar2 = iVar3;
  }
LAB_002c8a09:
  bVar4 = iVar2 != 0;
  iVar2 = iVar2 + -1;
  if (bVar4) {
    element = _nextElement(this);
    if (element != (UHashElement *)0x0) {
      if (all == '\0') goto code_r0x002c8a22;
      goto LAB_002c8a31;
    }
  }
  return (UBool)iVar3;
code_r0x002c8a22:
  UVar1 = _isEvictable(this,element);
  if (UVar1 != '\0') {
LAB_002c8a31:
    value = (SharedObject *)(element->value).pointer;
    uhash_removeElement_63(this->fHashtable,element);
    removeSoftRef(this,value);
    iVar3 = 1;
  }
  goto LAB_002c8a09;
}

Assistant:

UBool UnifiedCache::_flush(UBool all) const {
    UBool result = FALSE;
    int32_t origSize = uhash_count(fHashtable);
    for (int32_t i = 0; i < origSize; ++i) {
        const UHashElement *element = _nextElement();
        if (element == nullptr) {
            break;
        }
        if (all || _isEvictable(element)) {
            const SharedObject *sharedObject =
                    (const SharedObject *) element->value.pointer;
            U_ASSERT(sharedObject->cachePtr == this);
            uhash_removeElement(fHashtable, element);
            removeSoftRef(sharedObject);    // Deletes the sharedObject when softRefCount goes to zero.
            result = TRUE;
        }
    }
    return result;
}